

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

int vrna_strcat_vprintf(char **dest,char *format,__va_list_tag *args)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  void *local_70;
  undefined8 uStack_68;
  va_list copy;
  size_t new_count;
  size_t old_count;
  int local_38;
  int l2;
  int l1;
  int r;
  char *buf;
  __va_list_tag *args_local;
  char *format_local;
  char **dest_local;
  
  if ((dest == (char **)0x0) || (format == (char *)0x0)) {
    dest_local._4_4_ = -1;
  }
  else {
    copy[0].overflow_arg_area = args->reg_save_area;
    uStack_68._0_4_ = args->gp_offset;
    uStack_68._4_4_ = args->fp_offset;
    copy[0]._0_8_ = args->overflow_arg_area;
    l2 = -1;
    pcVar3 = *dest;
    if (pcVar3 == (char *)0x0) {
      local_70 = (void *)0x0;
    }
    else {
      local_70 = (void *)strlen(pcVar3);
    }
    iVar1 = vsnprintf((char *)0x0,0,format,args);
    copy[0].reg_save_area = (void *)(long)iVar1;
    iVar2 = (int)local_70;
    old_count._4_4_ = iVar2;
    local_38 = iVar1;
    if (copy[0].reg_save_area < local_70) {
      old_count._4_4_ = iVar1;
      local_38 = iVar2;
    }
    if (((copy[0].reg_save_area == (void *)0x0) || (local_38 == -1)) ||
       (-(long)local_38 - 1U <= (ulong)(long)old_count._4_4_)) {
      if (copy[0].reg_save_area == (void *)0x0) {
        l2 = iVar2;
      }
    }
    else {
      pcVar3 = (char *)vrna_realloc(pcVar3,iVar2 + iVar1 + 1);
      if (pcVar3 == (char *)0x0) {
        l2 = -1;
      }
      else {
        l2 = vsnprintf(pcVar3 + (long)local_70,(long)copy[0].reg_save_area + 1,format,&uStack_68);
        if (l2 < 0) {
          free(pcVar3);
        }
        else {
          *dest = pcVar3;
          l2 = iVar2 + (int)copy[0].reg_save_area;
        }
      }
    }
    if (l2 == -1) {
      vrna_message_warning("vrna_strcat_printf: memory allocation failure!");
      *dest = (char *)0x0;
    }
    dest_local._4_4_ = l2;
  }
  return dest_local._4_4_;
}

Assistant:

PUBLIC int
vrna_strcat_vprintf(char        **dest,
                    const char  *format,
                    va_list     args)
{
  char    *buf;
  int     r, l1, l2;
  size_t  old_count, new_count;

  if ((!dest) || (!format))
    return -1;

  va_list copy;
  va_copy(copy, args);

  r         = -1;
  buf       = *dest;
  old_count = (buf) ? strlen(buf) : 0;

  /* retrieve the number of characters that the string requires */
#ifdef _WIN32
  /*
   * vsnprintf() in Windows is not ANSI compliant, although it's
   * "...included for compliance to the ANSI standard"
   * Thus, we use _vscprintf() that explicitly counts characters
   */
  new_count = _vscprintf(format, args);
#else
  new_count = vsnprintf(NULL, 0, format, args);
#endif

  /* determine longer and shorter part of new string for INT overflow protection */
  if (old_count > new_count) {
    l1  = old_count;
    l2  = new_count;
  } else {
    l1  = new_count;
    l2  = old_count;
  }

  if ((new_count > 0) && (l1 < SIZE_MAX) && ((SIZE_MAX - l1) > l2)) {
    buf = (char *)vrna_realloc(buf, sizeof(char) * (old_count + new_count + 1));
    if (buf == NULL) {
      r = -1;
    } else if ((r = vsnprintf(buf + old_count, new_count + 1, format, copy)) < 0) {
      free(buf);
    } else {
      *dest = buf;
      r     = old_count + new_count;
    }
  } else if (new_count == 0) {
    /* we do not treat empty format string as error */
    r = (int)old_count;
  }

  va_end(copy);  /* Each va_start() or va_copy() needs a va_end() */

  /* check for any memory allocation error indicated by r == -1 */
  if (r == -1) {
    vrna_message_warning("vrna_strcat_printf: memory allocation failure!");
    *dest = NULL;
  }

  return r;
}